

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O0

QList<std::pair<double,_double>_> * __thiscall
QGraphicsItemAnimation::rotationList(QGraphicsItemAnimation *this)

{
  int iVar1;
  qsizetype qVar2;
  long in_RSI;
  QList<std::pair<double,_double>_> *in_RDI;
  qsizetype in_stack_00000028;
  int i;
  int numRotations;
  QList<std::pair<double,_double>_> *list;
  double *in_stack_ffffffffffffffb8;
  const_reference in_stack_ffffffffffffffc0;
  int local_1c;
  uint3 in_stack_ffffffffffffffec;
  uint uVar3;
  
  uVar3 = (uint)in_stack_ffffffffffffffec;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (pair<double,_double> *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<std::pair<double,_double>_>::QList((QList<std::pair<double,_double>_> *)0xa61a33);
  qVar2 = QList<QGraphicsItemAnimationPrivate::Pair>::size
                    ((QList<QGraphicsItemAnimationPrivate::Pair> *)(*(long *)(in_RSI + 0x10) + 0xb8)
                    );
  iVar1 = (int)qVar2;
  QList<std::pair<double,_double>_>::reserve
            ((QList<std::pair<double,_double>_> *)CONCAT44(uVar3,iVar1),in_stack_00000028);
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    in_stack_ffffffffffffffc0 =
         QList<QGraphicsItemAnimationPrivate::Pair>::at
                   ((QList<QGraphicsItemAnimationPrivate::Pair> *)in_stack_ffffffffffffffc0,
                    (qsizetype)in_stack_ffffffffffffffb8);
    QList<QGraphicsItemAnimationPrivate::Pair>::at
              ((QList<QGraphicsItemAnimationPrivate::Pair> *)in_stack_ffffffffffffffc0,
               (qsizetype)in_stack_ffffffffffffffb8);
    QList<std::pair<double,double>>::emplace_back<double_const&,double_const&>
              ((QList<std::pair<double,_double>_> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8,(double *)0xa61abf);
  }
  return in_RDI;
}

Assistant:

QList<std::pair<qreal, qreal> > QGraphicsItemAnimation::rotationList() const
{
    QList<std::pair<qreal, qreal>> list;
    const int numRotations = d->rotation.size();
    list.reserve(numRotations);
    for (int i = 0; i < numRotations; ++i)
        list.emplace_back(d->rotation.at(i).step, d->rotation.at(i).value);

    return list;
}